

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int32_suite::fail_array8_int32_overflow(void)

{
  array<int,_1UL> value;
  value_type input [10];
  decoder decoder;
  undefined4 local_58;
  return_type local_54;
  size_type local_50;
  uchar local_48 [16];
  decoder local_38;
  
  local_38.input._M_str = local_48;
  local_48[0] = 0xac;
  local_48[1] = '\b';
  local_48[2] = '\x11';
  local_48[3] = '\"';
  local_48[4] = '3';
  local_48[5] = 'D';
  local_48[6] = 'U';
  local_48[7] = 'f';
  local_48[8] = 'w';
  local_48[9] = 0x88;
  local_38.input._M_len = 10;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_54 = 0;
  local_50 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::int32>::decode(&local_38,&local_54,1);
  local_58 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8c0,"void compact_int32_suite::fail_array8_int32_overflow()",&local_50,&local_58);
  return;
}

Assistant:

void fail_array8_int32_overflow()
{
    const value_type input[] = { token::code::array8_int32, 0x08, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    std::array<std::int32_t, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}